

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::EnumDescriptorProto::InternalSerializeWithCachedSizesToArray
          (EnumDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  EnumValueDescriptorProto *this_00;
  EnumOptions *this_01;
  EnumDescriptorProto_EnumReservedRange *this_02;
  string *s;
  size_t __n;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  
  uVar5 = (this->_has_bits_).has_bits_[0];
  if ((uVar5 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,1,(this->name_).ptr_,target);
  }
  iVar1 = (this->value_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (EnumValueDescriptorProto *)
                ((this->value_).super_RepeatedPtrFieldBase.rep_)->elements[iVar8];
      *target = '\x12';
      uVar6 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar6 < 0x80) {
        target[1] = (byte)uVar6;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          target[2] = (uint8)(uVar6 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar6 = uVar6 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar6 | 0x80;
            uVar4 = uVar6 >> 7;
            puVar10 = puVar11 + 1;
            bVar3 = 0x3fff < uVar6;
            uVar6 = uVar4;
          } while (bVar3);
          *puVar11 = (uint8)uVar4;
        }
      }
      target = EnumValueDescriptorProto::InternalSerializeWithCachedSizesToArray
                         (this_00,puVar10,stream);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  if ((uVar5 & 2) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = this->options_;
    *target = '\x1a';
    uVar5 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    if (uVar5 < 0x80) {
      target[1] = (byte)uVar5;
      puVar10 = target + 2;
    }
    else {
      target[1] = (byte)uVar5 | 0x80;
      if (uVar5 < 0x4000) {
        target[2] = (uint8)(uVar5 >> 7);
        puVar10 = target + 3;
      }
      else {
        puVar10 = target + 3;
        uVar5 = uVar5 >> 7;
        do {
          puVar11 = puVar10;
          puVar11[-1] = (byte)uVar5 | 0x80;
          uVar6 = uVar5 >> 7;
          puVar10 = puVar11 + 1;
          bVar3 = 0x3fff < uVar5;
          uVar5 = uVar6;
        } while (bVar3);
        *puVar11 = (uint8)uVar6;
      }
    }
    target = EnumOptions::InternalSerializeWithCachedSizesToArray(this_01,puVar10,stream);
  }
  iVar1 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar8 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_02 = (EnumDescriptorProto_EnumReservedRange *)
                ((this->reserved_range_).super_RepeatedPtrFieldBase.rep_)->elements[iVar8];
      *target = '\"';
      uVar5 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar5 < 0x80) {
        target[1] = (byte)uVar5;
        puVar10 = target + 2;
      }
      else {
        target[1] = (byte)uVar5 | 0x80;
        if (uVar5 < 0x4000) {
          target[2] = (uint8)(uVar5 >> 7);
          puVar10 = target + 3;
        }
        else {
          puVar10 = target + 3;
          uVar5 = uVar5 >> 7;
          do {
            puVar11 = puVar10;
            puVar11[-1] = (byte)uVar5 | 0x80;
            uVar6 = uVar5 >> 7;
            puVar10 = puVar11 + 1;
            bVar3 = 0x3fff < uVar5;
            uVar5 = uVar6;
          } while (bVar3);
          *puVar11 = (uint8)uVar6;
        }
      }
      target = EnumDescriptorProto_EnumReservedRange::InternalSerializeWithCachedSizesToArray
                         (this_02,puVar10,stream);
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar1);
  }
  lVar9 = (long)(this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < lVar9) {
    lVar7 = 0;
    do {
      s = (string *)((this->reserved_name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar7];
      __n = s->_M_string_length;
      if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '*';
        target[1] = (uint8)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        target = target + __n + 2;
      }
      else {
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,5,s,target);
      }
      lVar7 = lVar7 + 1;
    } while (lVar9 != lVar7);
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar10 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target,stream);
    return puVar10;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* EnumDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.EnumDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_value_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_value(i), target, stream);
  }

  // optional .google.protobuf.EnumOptions options = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::options(this), target, stream);
  }

  // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_reserved_range_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(4, this->_internal_reserved_range(i), target, stream);
  }

  // repeated string reserved_name = 5;
  for (int i = 0, n = this->_internal_reserved_name_size(); i < n; i++) {
    const auto& s = this->_internal_reserved_name(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.EnumDescriptorProto.reserved_name");
    target = stream->WriteString(5, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.EnumDescriptorProto)
  return target;
}